

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O3

void __thiscall QWidgetAction::releaseWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  QWidget *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QWidget *local_58;
  undefined8 local_50;
  anon_class_8_1_54a39814_for__M_pred local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&this->field_0x8;
  if (*(long *)(lVar3 + 0x1a8) != 0) {
    if (*(int *)(*(long *)(lVar3 + 0x1a8) + 4) == 0) {
      pQVar4 = (QWidget *)0x0;
    }
    else {
      pQVar4 = *(QWidget **)(lVar3 + 0x1b0);
    }
    if (pQVar4 == widget) {
      QWidget::hide(*(QWidget **)(lVar3 + 0x1b0));
      QWidget::setParent(*(QWidget **)(lVar3 + 0x1b0),(QWidget *)0x0);
      *(byte *)(lVar3 + 0x1d0) = *(byte *)(lVar3 + 0x1d0) & 0xfe;
      goto LAB_00398ccb;
    }
  }
  if (*(long *)(lVar3 + 0x1c8) != 0) {
    lVar5 = 0;
    do {
      if (*(long *)(lVar3 + 0x1c8) << 3 == lVar5) goto LAB_00398ccb;
      lVar1 = lVar5 + 8;
      plVar2 = (long *)(*(long *)(lVar3 + 0x1c0) + lVar5);
      lVar5 = lVar1;
    } while ((QWidget *)*plVar2 != widget);
    if (lVar1 != 0) {
      local_48.t = (QWindow **)QObject::destroyed;
      local_40 = 0;
      local_58 = (QWidget *)QWidgetActionPrivate::widgetDestroyed;
      local_50 = 0;
      QObject::disconnectImpl
                (&widget->super_QObject,&local_48.t,*(QObject **)(lVar3 + 8),&local_58,
                 (QMetaObject *)&QObject::staticMetaObject);
      local_58 = widget;
      local_48.t = (QWindow **)&local_58;
      QtPrivate::
      sequential_erase_if<QList<QWidget*>,QtPrivate::sequential_erase<QList<QWidget*>,QWidget*>(QList<QWidget*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
                ((QList<QWidget_*> *)(lVar3 + 0x1b8),&local_48);
      (**(code **)(*(long *)this + 0x68))(this,widget);
    }
  }
LAB_00398ccb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetAction::releaseWidget(QWidget *widget)
{
    Q_D(QWidgetAction);

    if (widget == d->defaultWidget) {
        d->defaultWidget->hide();
        d->defaultWidget->setParent(nullptr);
        d->defaultWidgetInUse = false;
        return;
    }

    if (!d->createdWidgets.contains(widget))
        return;

    QObjectPrivate::disconnect(widget, &QWidget::destroyed,
                               d, &QWidgetActionPrivate::widgetDestroyed);
    d->createdWidgets.removeAll(widget);
    deleteWidget(widget);
}